

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::parse_bson_element_internal
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,char_int_type element_type,size_t element_type_parse_position)

{
  bool bVar1;
  undefined1 uVar2;
  pointer pvVar3;
  size_type __maxlen;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  array<char,_3UL> cr;
  int64_t value_3;
  int32_t value_2;
  binary_t value_1;
  int32_t len_1;
  string_t value;
  int32_t len;
  double number;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffde8;
  undefined1 *puVar4;
  double *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  input_format_t format;
  allocator *paVar5;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffe08;
  bool local_1c2;
  bool local_1c1;
  bool local_1af;
  bool local_1ab;
  bool local_189;
  undefined1 local_178 [23];
  allocator local_161;
  string local_160 [32];
  string local_140 [56];
  string_t *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_ffffffffffffff08;
  string local_f0 [4];
  int in_stack_ffffffffffffff14;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_ffffffffffffff18;
  array<char,_3UL> local_cc;
  undefined8 local_c8;
  undefined4 local_bc;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  string local_88 [4];
  int in_stack_ffffffffffffff7c;
  allocator local_49;
  string local_48 [32];
  undefined8 local_28;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_20;
  undefined4 local_14;
  bool local_1;
  
  format = (input_format_t)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  switch(in_ESI) {
  case 1:
    local_28 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<double,true>(in_stack_fffffffffffffe08,format,in_stack_fffffffffffffdf8);
    local_189 = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"",&local_49);
      local_189 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_float((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                 (number_float_t)
                                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                                 (string_t *)0xe07104);
    }
    local_1 = local_189;
    if (bVar1) {
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    break;
  case 2:
    std::__cxx11::string::string(local_88);
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe08,format,(int *)in_stack_fffffffffffffdf8);
    local_1ab = false;
    if (bVar1) {
      bVar1 = get_bson_string<int>
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                         in_stack_fffffffffffffef8);
      local_1ab = false;
      if (bVar1) {
        local_1ab = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::string((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             (string_t *)
                             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      }
    }
    local_1 = local_1ab;
    std::__cxx11::string::~string(local_88);
    break;
  case 3:
    local_1 = parse_bson_internal(in_stack_fffffffffffffde8);
    break;
  case 4:
    local_1 = parse_bson_array(in_stack_fffffffffffffde8);
    break;
  case 5:
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe08,format,(int *)in_stack_fffffffffffffdf8);
    local_1af = false;
    if (bVar1) {
      bVar1 = get_bson_binary<int>
                        (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                         (binary_t *)in_stack_ffffffffffffff08);
      local_1af = false;
      if (bVar1) {
        local_1af = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::binary((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             (binary_t *)
                             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      }
    }
    local_1 = local_1af;
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0xe073a0);
    break;
  default:
    local_cc._M_elems[2] = '\0';
    local_cc._M_elems[0] = '\0';
    local_cc._M_elems[1] = '\0';
    local_20 = in_RDX;
    local_14 = in_ESI;
    pvVar3 = std::array<char,_3UL>::data((array<char,_3UL> *)0xe0750f);
    __maxlen = std::array<char,_3UL>::size(&local_cc);
    snprintf(pvVar3,__maxlen,"%.2hhX",(ulong)(byte)local_14);
    pvVar3 = std::array<char,_3UL>::data((array<char,_3UL> *)0xe07564);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pvVar3,(allocator *)&stack0xffffffffffffff0f);
    pvVar3 = std::array<char,_3UL>::data((array<char,_3UL> *)0xe075ae);
    paVar5 = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,pvVar3,paVar5);
    std::operator+((char *)in_stack_fffffffffffffde8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    puVar4 = local_178;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 (nullptr_t)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    parse_error::
    create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_ffffffffffffff7c,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    uVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::parse_error<nlohmann::detail::parse_error>
                      (local_20,(size_t)puVar4,
                       (string *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                       (parse_error *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8))
    ;
    local_1 = (bool)uVar2;
    parse_error::~parse_error((parse_error *)0xe07677);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT17(uVar2,in_stack_fffffffffffffde0));
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
    break;
  case 8:
    get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::boolean((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                        (bool)in_stack_fffffffffffffddf);
    break;
  case 10:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::null((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    break;
  case 0x10:
    local_bc = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe08,format,(int *)in_stack_fffffffffffffdf8);
    local_1c1 = false;
    if (bVar1) {
      local_1c1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    }
    local_1 = local_1c1;
    break;
  case 0x12:
    local_c8 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<long,true>
                      (in_stack_fffffffffffffe08,format,(long *)in_stack_fffffffffffffdf8);
    local_1c2 = false;
    if (bVar1) {
      local_1c2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    }
    local_1 = local_1c2;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_bson_element_internal(const char_int_type element_type,
                                     const std::size_t element_type_parse_position)
    {
        switch (element_type)
        {
            case 0x01: // double
            {
                double number{};
                return get_number<double, true>(input_format_t::bson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0x02: // string
            {
                std::int32_t len{};
                string_t value;
                return get_number<std::int32_t, true>(input_format_t::bson, len) && get_bson_string(len, value) && sax->string(value);
            }

            case 0x03: // object
            {
                return parse_bson_internal();
            }

            case 0x04: // array
            {
                return parse_bson_array();
            }

            case 0x05: // binary
            {
                std::int32_t len{};
                binary_t value;
                return get_number<std::int32_t, true>(input_format_t::bson, len) && get_bson_binary(len, value) && sax->binary(value);
            }

            case 0x08: // boolean
            {
                return sax->boolean(get() != 0);
            }

            case 0x0A: // null
            {
                return sax->null();
            }

            case 0x10: // int32
            {
                std::int32_t value{};
                return get_number<std::int32_t, true>(input_format_t::bson, value) && sax->number_integer(value);
            }

            case 0x12: // int64
            {
                std::int64_t value{};
                return get_number<std::int64_t, true>(input_format_t::bson, value) && sax->number_integer(value);
            }

            default: // anything else not supported (yet)
            {
                std::array<char, 3> cr{{}};
                static_cast<void>((std::snprintf)(cr.data(), cr.size(), "%.2hhX", static_cast<unsigned char>(element_type))); // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
                return sax->parse_error(element_type_parse_position, std::string(cr.data()), parse_error::create(114, element_type_parse_position, "Unsupported BSON record type 0x" + std::string(cr.data()), BasicJsonType()));
            }
        }
    }